

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedPrimitiveFieldGenerator::GenerateSerializedSizeCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  Type type;
  int iVar1;
  char *pcVar2;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"{\n  int dataSize = 0;\n");
  io::Printer::Indent(printer);
  type = GetType(this->descriptor_);
  iVar1 = anon_unknown_3::FixedSize(type);
  pcVar2 = "dataSize = $fixed_size$ * get$capitalized_name$List().size();\n";
  if (iVar1 == -1) {
    pcVar2 = 
    "for (int i = 0; i < $name$_.size(); i++) {\n  dataSize += com.google.protobuf.CodedOutputStream\n    .compute$capitalized_type$SizeNoTag($name$_.get(i));\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar2);
  io::Printer::Print(printer,"size += dataSize;\n");
  pcVar2 = "size += $tag_size$ * get$capitalized_name$List().size();\n";
  if (*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) != '\0') {
    pcVar2 = 
    "if (!get$capitalized_name$List().isEmpty()) {\n  size += $tag_size$;\n  size += com.google.protobuf.CodedOutputStream\n      .computeInt32SizeNoTag(dataSize);\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar2);
  if (*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) == '\x01') {
    io::Printer::Print(printer,variables,"$name$MemoizedSerializedSize = dataSize;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int dataSize = 0;\n");
  printer->Indent();

  if (FixedSize(GetType(descriptor_)) == -1) {
    printer->Print(variables_,
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  dataSize += com.google.protobuf.CodedOutputStream\n"
      "    .compute$capitalized_type$SizeNoTag($name$_.get(i));\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "dataSize = $fixed_size$ * get$capitalized_name$List().size();\n");
  }

  printer->Print(
      "size += dataSize;\n");

  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (!get$capitalized_name$List().isEmpty()) {\n"
      "  size += $tag_size$;\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "      .computeInt32SizeNoTag(dataSize);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * get$capitalized_name$List().size();\n");
  }

  // cache the data size for packed fields.
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "$name$MemoizedSerializedSize = dataSize;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}